

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          bool is_writer)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_1a;
  byte local_19;
  _anonymous_namespace_ *p_Stack_18;
  bool is_writer_local;
  FieldDescriptor *field_local;
  string *name;
  
  local_19 = (byte)field & 1;
  local_1a = 0;
  p_Stack_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  JSBinaryReaderMethodType_abi_cxx11_(__return_storage_ptr__,this,field);
  bVar1 = FieldDescriptor::is_packed((FieldDescriptor *)p_Stack_18);
  if (bVar1) {
    std::operator+(&local_50,"Packed",__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else if (((local_19 & 1) != 0) &&
          (bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)p_Stack_18), bVar1)) {
    std::operator+(&local_70,"Repeated",__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

string JSBinaryReadWriteMethodName(const FieldDescriptor* field,
                                   bool is_writer) {
  string name = JSBinaryReaderMethodType(field);
  if (field->is_packed()) {
    name = "Packed" + name;
  } else if (is_writer && field->is_repeated()) {
    name = "Repeated" + name;
  }
  return name;
}